

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

ll_elem * ll_pred(ll_head *q_head,ll_elem *n)

{
  ll_elem *e;
  undefined8 local_20;
  ll_elem *p;
  ll_elem *n_local;
  ll_head *q_head_local;
  
  e = pred(q_head,n);
  local_20 = (ll_head *)ptr_clear(e);
  if (local_20 == q_head) {
    deref_release(q_head,(ll_elem *)local_20,1);
    local_20 = (ll_head *)0x0;
  }
  return &local_20->q;
}

Assistant:

struct ll_elem*
ll_pred(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*p;

	p = pred(q_head, n);

	/* Clean away the flag bits. */
	p = ptr_clear(p);
	if (p == &q_head->q) {
		/* Don't return q: it is not an element of the list. */
		deref_release(q_head, p, 1);
		p = NULL;
	}
	return p;
}